

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kf_test.cc
# Opt level: O1

void __thiscall
anon_unknown.dwarf_8c5559::KeyFrameIntervalTestLarge::~KeyFrameIntervalTestLarge
          (KeyFrameIntervalTestLarge *this)

{
  code *pcVar1;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

~KeyFrameIntervalTestLarge() override = default;